

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btQuickprof.cpp
# Opt level: O2

btScalar __thiscall btClock::getTimeSeconds(btClock *this)

{
  unsigned_long uVar1;
  
  uVar1 = getTimeMicroseconds(this);
  return (float)uVar1 * 1e-06;
}

Assistant:

btScalar btClock::getTimeSeconds()
{
	static const btScalar microseconds_to_seconds = btScalar(0.000001);
	return btScalar(getTimeMicroseconds()) * microseconds_to_seconds;
}